

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_tables.cpp
# Opt level: O1

void __thiscall
YAJLHuffmanTable::HFTree::HFTree(HFTree *this,YAJLHuffmanTable *table,bitio_stream *bstream)

{
  byte bVar1;
  u8 uVar2;
  long lVar3;
  bool bVar4;
  void *pvVar5;
  ssize_t sVar6;
  HFNode *pHVar7;
  HFNode *pHVar8;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int i;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  u8 *var_codes [16];
  int local_d4;
  long alStack_b8 [17];
  
  *(undefined4 *)((long)&this->root + 7) = 0;
  this->root = (HFNode *)0x0;
  if (table != (YAJLHuffmanTable *)0x0) {
    lVar9 = 0;
    do {
      bVar1 = table->ncodes[lVar9];
      pvVar5 = operator_new__((ulong)bVar1);
      alStack_b8[lVar9] = (long)pvVar5;
      if ((ulong)bVar1 != 0) {
        uVar12 = 0;
        __buf = extraout_RDX;
        do {
          sVar6 = bitio::bitio_stream::read(bstream,8,__buf,in_RCX);
          *(char *)((long)pvVar5 + uVar12) = (char)sVar6;
          uVar12 = uVar12 + 1;
          __buf = extraout_RDX_00;
        } while (uVar12 < table->ncodes[lVar9]);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x10);
    pHVar7 = (HFNode *)operator_new(0x18);
    pHVar7->left = (HFNode *)0x0;
    pHVar7->right = (HFNode *)0x0;
    pHVar7->symbol = '\0';
    this->root = pHVar7;
    local_d4 = 1;
    lVar9 = 0;
    uVar11 = 0;
    do {
      if (table->ncodes[lVar9] != '\0') {
        lVar3 = alStack_b8[lVar9];
        lVar13 = 0;
        uVar10 = 0;
        do {
          uVar2 = *(u8 *)(lVar3 + lVar13);
          pHVar7 = this->root;
          iVar14 = local_d4;
          do {
            if (((uVar11 & 0xffff) >> (iVar14 - 1U & 0x1f) & 1) == 0) {
              pHVar8 = pHVar7->left;
            }
            else {
              pHVar8 = pHVar7->right;
              pHVar7 = (HFNode *)&pHVar7->right;
            }
            if (pHVar8 == (HFNode *)0x0) {
              pHVar8 = (HFNode *)operator_new(0x18);
              pHVar8->left = (HFNode *)0x0;
              pHVar8->right = (HFNode *)0x0;
              pHVar8->symbol = '\0';
              pHVar7->left = pHVar8;
            }
            pHVar7 = pHVar7->left;
            iVar15 = iVar14 + -1;
            bVar4 = 0 < iVar14;
            iVar14 = iVar15;
          } while (iVar15 != 0 && bVar4);
          if (lVar9 != 0) {
            pHVar7->symbol = uVar2;
          }
          uVar11 = (uVar11 & 0xffff) + 1;
          lVar13 = lVar13 + 1;
          uVar10 = uVar10 + 1;
        } while (uVar10 < table->ncodes[lVar9]);
      }
      uVar11 = uVar11 * 2;
      lVar9 = lVar9 + 1;
      local_d4 = local_d4 + 1;
    } while (lVar9 != 0x10);
    lVar9 = 0;
    do {
      free((void *)alStack_b8[lVar9]);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x10);
  }
  return;
}

Assistant:

YAJLHuffmanTable::HFTree::HFTree(YAJLHuffmanTable *table, bitio::bitio_stream *bstream) {
    if (table == nullptr) {
        return;
    }



    auto ncodes = table->ncodes;
    u8 *var_codes[16];


    for (int i = 0; i < 16; i++) {
        var_codes[i] = new u8[ncodes[i]];
        for (int j = 0; j < ncodes[i]; j++) {
            var_codes[i][j] = bstream->read(0x8);
        }
    }

    u16 code = 0;
    u32 count = 0;
    root = new HFNode;

    // construct huffman-tree
    for (int i = 0; i < 16; i++) {
        auto in_count = 0;
        for (int j = 0; j < ncodes[i]; j++) {
            insert(code++, i, var_codes[i][in_count]);
            in_count++;
            count++;
        }
        code <<= 1;
    }

    for (int i = 0; i < 0x10; i++) {
        free(var_codes[i]);
    }
}